

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headerssync.cpp
# Opt level: O3

void __thiscall
HeadersSyncState::HeadersSyncState
          (HeadersSyncState *this,NodeId id,Params *consensus_params,CBlockIndex *chain_start,
          arith_uint256 *minimum_required_work)

{
  uint256 *puVar1;
  base_blob<256U> *pbVar2;
  bool bVar3;
  int i;
  uint64_t uVar4;
  long lVar5;
  time_point tVar6;
  int64_t iVar7;
  Logger *this_00;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  undefined1 local_c0 [16];
  ChaCha20 local_b0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext((FastRandomContext *)local_c0,false);
  do {
    uVar4 = RandomMixin<FastRandomContext>::randbits((RandomMixin<FastRandomContext> *)local_c0,10);
  } while (0x266 < uVar4);
  ChaCha20::~ChaCha20(&local_b0);
  this->m_commit_offset = (uint)uVar4;
  this->m_id = id;
  this->m_consensus_params = consensus_params;
  this->m_chain_start = chain_start;
  lVar5 = 0;
  do {
    (this->m_minimum_required_work).super_base_uint<256U>.pn[lVar5] =
         (minimum_required_work->super_base_uint<256U>).pn[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  lVar5 = 0;
  do {
    (this->m_current_chain_work).super_base_uint<256U>.pn[lVar5] =
         (chain_start->nChainWork).super_base_uint<256U>.pn[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  SaltedTxidHasher::SaltedTxidHasher(&this->m_hasher);
  (this->m_header_commitments).m_deque.
  super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_header_commitments).m_deque.
  super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->m_header_commitments).m_deque.
  super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_header_commitments).m_deque.
  super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_header_commitments).m_deque.
  super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_header_commitments).m_deque.
  super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_header_commitments).m_deque.
  super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_header_commitments).m_deque.
  super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_header_commitments).m_deque.
  super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_header_commitments).m_deque.
  super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>::_M_initialize_map
            ((_Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_> *)
             &this->m_header_commitments,0);
  (this->m_header_commitments).m_pad_begin = 0;
  (this->m_header_commitments).m_pad_end = 0;
  this->m_max_commitments = 0;
  CBlockIndex::GetBlockHeader(&this->m_last_header_received,this->m_chain_start);
  this->m_current_height = (long)chain_start->nHeight;
  (this->m_redownloaded_headers).
  super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_redownloaded_headers).
  super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->m_redownloaded_headers).
  super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_redownloaded_headers).
  super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_redownloaded_headers).
  super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_redownloaded_headers).
  super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_redownloaded_headers).
  super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_redownloaded_headers).
  super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_redownloaded_headers).
  super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_redownloaded_headers).
  super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>::_M_initialize_map
            (&(this->m_redownloaded_headers).
              super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>,0);
  this->m_download_state = PRESYNC;
  this->m_redownload_buffer_last_height = 0;
  puVar1 = &this->m_redownload_buffer_last_hash;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar2 = &(this->m_redownload_buffer_last_hash).super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[8] = '\0';
  (pbVar2->m_data)._M_elems[9] = '\0';
  (pbVar2->m_data)._M_elems[10] = '\0';
  (pbVar2->m_data)._M_elems[0xb] = '\0';
  (pbVar2->m_data)._M_elems[0xc] = '\0';
  (pbVar2->m_data)._M_elems[0xd] = '\0';
  (pbVar2->m_data)._M_elems[0xe] = '\0';
  (pbVar2->m_data)._M_elems[0xf] = '\0';
  pbVar2 = &(this->m_redownload_buffer_last_hash).super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[0x10] = '\0';
  (pbVar2->m_data)._M_elems[0x11] = '\0';
  (pbVar2->m_data)._M_elems[0x12] = '\0';
  (pbVar2->m_data)._M_elems[0x13] = '\0';
  (pbVar2->m_data)._M_elems[0x14] = '\0';
  (pbVar2->m_data)._M_elems[0x15] = '\0';
  (pbVar2->m_data)._M_elems[0x16] = '\0';
  (pbVar2->m_data)._M_elems[0x17] = '\0';
  pbVar2 = &(this->m_redownload_buffer_last_hash).super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[0x18] = '\0';
  (pbVar2->m_data)._M_elems[0x19] = '\0';
  (pbVar2->m_data)._M_elems[0x1a] = '\0';
  (pbVar2->m_data)._M_elems[0x1b] = '\0';
  (pbVar2->m_data)._M_elems[0x1c] = '\0';
  (pbVar2->m_data)._M_elems[0x1d] = '\0';
  (pbVar2->m_data)._M_elems[0x1e] = '\0';
  (pbVar2->m_data)._M_elems[0x1f] = '\0';
  puVar1 = &this->m_redownload_buffer_first_prev_hash;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar2 = &(this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[8] = '\0';
  (pbVar2->m_data)._M_elems[9] = '\0';
  (pbVar2->m_data)._M_elems[10] = '\0';
  (pbVar2->m_data)._M_elems[0xb] = '\0';
  (pbVar2->m_data)._M_elems[0xc] = '\0';
  (pbVar2->m_data)._M_elems[0xd] = '\0';
  (pbVar2->m_data)._M_elems[0xe] = '\0';
  (pbVar2->m_data)._M_elems[0xf] = '\0';
  pbVar2 = &(this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[0x10] = '\0';
  (pbVar2->m_data)._M_elems[0x11] = '\0';
  (pbVar2->m_data)._M_elems[0x12] = '\0';
  (pbVar2->m_data)._M_elems[0x13] = '\0';
  (pbVar2->m_data)._M_elems[0x14] = '\0';
  (pbVar2->m_data)._M_elems[0x15] = '\0';
  (pbVar2->m_data)._M_elems[0x16] = '\0';
  (pbVar2->m_data)._M_elems[0x17] = '\0';
  pbVar2 = &(this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[0x18] = '\0';
  (pbVar2->m_data)._M_elems[0x19] = '\0';
  (pbVar2->m_data)._M_elems[0x1a] = '\0';
  (pbVar2->m_data)._M_elems[0x1b] = '\0';
  (pbVar2->m_data)._M_elems[0x1c] = '\0';
  (pbVar2->m_data)._M_elems[0x1d] = '\0';
  (pbVar2->m_data)._M_elems[0x1e] = '\0';
  (pbVar2->m_data)._M_elems[0x1f] = '\0';
  (this->m_redownload_chain_work).super_base_uint<256U>.pn[0] = 0;
  (this->m_redownload_chain_work).super_base_uint<256U>.pn[1] = 0;
  (this->m_redownload_chain_work).super_base_uint<256U>.pn[2] = 0;
  (this->m_redownload_chain_work).super_base_uint<256U>.pn[3] = 0;
  (this->m_redownload_chain_work).super_base_uint<256U>.pn[4] = 0;
  (this->m_redownload_chain_work).super_base_uint<256U>.pn[5] = 0;
  *(undefined8 *)((long)(this->m_redownload_chain_work).super_base_uint<256U>.pn + 0x11) = 0;
  *(undefined8 *)((long)(this->m_redownload_chain_work).super_base_uint<256U>.pn + 0x19) = 0;
  tVar6 = NodeClock::now();
  iVar7 = CBlockIndex::GetMedianTimePast(chain_start);
  this->m_max_commitments =
       (((iVar7 * -1000000000 + (long)tVar6.__d.__r) / 1000000000) * 6 + 0xa8c0U) / 0x267;
  this_00 = LogInstance();
  bVar3 = BCLog::Logger::WillLogCategoryLevel(this_00,NET,Debug);
  if (bVar3) {
    base_uint<256u>::ToString_abi_cxx11_((string *)local_c0,&this->m_minimum_required_work);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/headerssync.cpp"
    ;
    source_file._M_len = 0x5f;
    logging_function._M_str = "HeadersSyncState";
    logging_function._M_len = 0x10;
    LogPrintFormatInternal<long,long,unsigned_long,std::__cxx11::string>
              (logging_function,source_file,0x2e,NET,Debug,(ConstevalFormatString<4U>)0xf6e8f2,
               &this->m_id,&this->m_current_height,&this->m_max_commitments,(string *)local_c0);
    if ((ChaCha20 *)local_c0._0_8_ != &local_b0) {
      operator_delete((void *)local_c0._0_8_,local_b0.m_aligned.input._0_8_ + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

HeadersSyncState::HeadersSyncState(NodeId id, const Consensus::Params& consensus_params,
        const CBlockIndex* chain_start, const arith_uint256& minimum_required_work) :
    m_commit_offset(FastRandomContext().randrange<unsigned>(HEADER_COMMITMENT_PERIOD)),
    m_id(id), m_consensus_params(consensus_params),
    m_chain_start(chain_start),
    m_minimum_required_work(minimum_required_work),
    m_current_chain_work(chain_start->nChainWork),
    m_last_header_received(m_chain_start->GetBlockHeader()),
    m_current_height(chain_start->nHeight)
{
    // Estimate the number of blocks that could possibly exist on the peer's
    // chain *right now* using 6 blocks/second (fastest blockrate given the MTP
    // rule) times the number of seconds from the last allowed block until
    // today. This serves as a memory bound on how many commitments we might
    // store from this peer, and we can safely give up syncing if the peer
    // exceeds this bound, because it's not possible for a consensus-valid
    // chain to be longer than this (at the current time -- in the future we
    // could try again, if necessary, to sync a longer chain).
    m_max_commitments = 6*(Ticks<std::chrono::seconds>(NodeClock::now() - NodeSeconds{std::chrono::seconds{chain_start->GetMedianTimePast()}}) + MAX_FUTURE_BLOCK_TIME) / HEADER_COMMITMENT_PERIOD;

    LogDebug(BCLog::NET, "Initial headers sync started with peer=%d: height=%i, max_commitments=%i, min_work=%s\n", m_id, m_current_height, m_max_commitments, m_minimum_required_work.ToString());
}